

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O0

bool __thiscall wasm::ExecutionResults::operator==(ExecutionResults *this,ExecutionResults *other)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  char *pcVar5;
  size_type sVar6;
  size_type sVar7;
  ulong uVar8;
  reference pvVar9;
  int __c;
  int __c_00;
  type *ptVar10;
  Name name_00;
  Name name_01;
  byte local_161;
  Literal local_150;
  Literal local_138;
  uint local_11c;
  byte local_115;
  Index i;
  Literals local_108;
  byte local_c9;
  Literals local_c8;
  Literals *local_90;
  type *otherValues;
  type *values;
  size_t local_78;
  ostream *local_70;
  size_t local_68;
  _Self local_60;
  _Self local_58;
  type *local_50;
  type *_;
  type *name;
  _Self local_38;
  iterator __end2;
  iterator __begin2;
  map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
  *__range2;
  ExecutionResults *other_local;
  ExecutionResults *this_local;
  
  if (((this->ignore & 1U) == 0) && ((other->ignore & 1U) == 0)) {
    __end2 = std::
             map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
             ::begin(&other->results);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
         ::end(&other->results);
    while (bVar1 = std::operator!=(&__end2,&local_38), bVar1) {
      name = &std::
              _Rb_tree_iterator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>
              ::operator*(&__end2)->first;
      _ = (type *)std::
                  get<0ul,wasm::Name_const,std::variant<wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>>
                            ((pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>
                              *)name);
      local_50 = std::
                 get<1ul,wasm::Name_const,std::variant<wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>>
                           ((pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>
                             *)name);
      local_58._M_node =
           (_Base_ptr)
           std::
           map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
           ::find(&this->results,(key_type *)_);
      local_60._M_node =
           (_Base_ptr)
           std::
           map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
           ::end(&this->results);
      bVar1 = std::operator==(&local_58,&local_60);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"[fuzz-exec] missing ");
        local_70 = *(ostream **)
                    &(_->
                     super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     ).
                     super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     ._M_u;
        local_68 = *(size_t *)
                    ((long)&(_->
                            super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            ).
                            super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            .
                            super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            .
                            super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            .
                            super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            .
                            super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            ._M_u + 8);
        name_00.super_IString.str._M_str = (char *)local_70;
        name_00.super_IString.str._M_len = local_68;
        poVar2 = wasm::operator<<((wasm *)poVar2,local_70,name_00);
        std::operator<<(poVar2,'\n');
        return false;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"[fuzz-exec] comparing ");
      values = *(type **)&(_->
                          super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          ).
                          super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          .
                          super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          .
                          super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          .
                          super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          .
                          super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          ._M_u;
      local_78 = *(size_t *)
                  ((long)&(_->
                          super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          ).
                          super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          .
                          super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          .
                          super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          .
                          super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          .
                          super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                          ._M_u + 8);
      name_01.super_IString.str._M_str = (char *)values;
      name_01.super_IString.str._M_len = local_78;
      poVar2 = wasm::operator<<((wasm *)poVar2,(ostream *)values,name_01);
      std::operator<<(poVar2,'\n');
      ptVar10 = _;
      pmVar3 = std::
               map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
               ::operator[](&this->results,(key_type *)_);
      pcVar4 = std::
               variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
               ::index(pmVar3,(char *)ptVar10,__c);
      ptVar10 = _;
      pmVar3 = std::
               map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
               ::operator[](&other->results,(key_type *)_);
      pcVar5 = std::
               variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
               ::index(pmVar3,(char *)ptVar10,__c_00);
      if (pcVar4 != pcVar5) {
        return false;
      }
      pmVar3 = std::
               map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
               ::operator[](&this->results,(key_type *)_);
      otherValues = std::
                    get_if<wasm::Literals,wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>
                              (pmVar3);
      pmVar3 = std::
               map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
               ::operator[](&other->results,(key_type *)_);
      local_90 = std::
                 get_if<wasm::Literals,wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>
                           (pmVar3);
      local_c9 = 0;
      local_115 = 0;
      local_161 = 0;
      if ((otherValues != (type *)0x0) &&
         (local_161 = 0, local_90 != (add_pointer_t<wasm::Literals>)0x0)) {
        Literals::Literals(&local_c8,otherValues);
        local_c9 = 1;
        Literals::Literals(&local_108,local_90);
        local_115 = 1;
        bVar1 = areEqual(this,&local_c8,&local_108);
        local_161 = bVar1 ^ 0xff;
      }
      if ((local_115 & 1) != 0) {
        Literals::~Literals(&local_108);
      }
      if ((local_c9 & 1) != 0) {
        Literals::~Literals(&local_c8);
      }
      if ((local_161 & 1) != 0) {
        return false;
      }
      std::
      _Rb_tree_iterator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>
      ::operator++(&__end2);
    }
    sVar6 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::size(&this->loggings);
    sVar7 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::size(&other->loggings);
    if (sVar6 == sVar7) {
      for (local_11c = 0; uVar8 = (ulong)local_11c,
          sVar6 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::size(&this->loggings),
          uVar8 < sVar6; local_11c = local_11c + 1) {
        pvVar9 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator[]
                           (&this->loggings,(ulong)local_11c);
        ::wasm::Literal::Literal(&local_138,pvVar9);
        pvVar9 = std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator[]
                           (&other->loggings,(ulong)local_11c);
        ::wasm::Literal::Literal(&local_150,pvVar9);
        bVar1 = areEqual(this,&local_138,&local_150);
        ::wasm::Literal::~Literal(&local_150);
        ::wasm::Literal::~Literal(&local_138);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      std::operator<<((ostream *)&std::cout,"logging counts not identical!\n");
      this_local._7_1_ = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"ignoring comparison of ExecutionResults!\n");
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(ExecutionResults& other) {
    if (ignore || other.ignore) {
      std::cout << "ignoring comparison of ExecutionResults!\n";
      return true;
    }
    for (auto& [name, _] : other.results) {
      if (results.find(name) == results.end()) {
        std::cout << "[fuzz-exec] missing " << name << '\n';
        return false;
      }
      std::cout << "[fuzz-exec] comparing " << name << '\n';
      if (results[name].index() != other.results[name].index()) {
        return false;
      }
      auto* values = std::get_if<Literals>(&results[name]);
      auto* otherValues = std::get_if<Literals>(&other.results[name]);
      if (values && otherValues && !areEqual(*values, *otherValues)) {
        return false;
      }
    }
    if (loggings.size() != other.loggings.size()) {
      std::cout << "logging counts not identical!\n";
      return false;
    }
    for (Index i = 0; i < loggings.size(); i++) {
      if (!areEqual(loggings[i], other.loggings[i])) {
        return false;
      }
    }
    return true;
  }